

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O1

int dsa_check_key(DSA *dsa)

{
  int iVar1;
  uint uVar2;
  int line;
  
  if (((dsa->p == (BIGNUM *)0x0) || (dsa->q == (BIGNUM *)0x0)) || (dsa->g == (BIGNUM *)0x0)) {
    iVar1 = 0x65;
    line = 0x21;
  }
  else {
    iVar1 = BN_is_negative(dsa->p);
    if ((((((iVar1 == 0) && (iVar1 = BN_is_negative(dsa->q), iVar1 == 0)) &&
          ((iVar1 = BN_is_zero(dsa->p), iVar1 == 0 &&
           ((iVar1 = BN_is_zero(dsa->q), iVar1 == 0 && (iVar1 = BN_is_odd(dsa->p), iVar1 != 0))))))
         && (iVar1 = BN_is_odd(dsa->q), iVar1 != 0)) &&
        (((iVar1 = BN_cmp((BIGNUM *)dsa->q,(BIGNUM *)dsa->p), iVar1 < 0 &&
          (iVar1 = BN_is_negative(dsa->g), iVar1 == 0)) && (iVar1 = BN_is_zero(dsa->g), iVar1 == 0))
        )) && (iVar1 = BN_cmp((BIGNUM *)dsa->g,(BIGNUM *)dsa->p), iVar1 < 0)) {
      iVar1 = BN_num_bits((BIGNUM *)dsa->q);
      if (((iVar1 == 0xa0) || (iVar1 == 0xe0)) || (iVar1 == 0x100)) {
        uVar2 = BN_num_bits((BIGNUM *)dsa->p);
        if (uVar2 < 0x2711) {
          if ((dsa->pub_key == (BIGNUM *)0x0) ||
             (((iVar1 = BN_is_negative(dsa->pub_key), iVar1 == 0 &&
               (iVar1 = BN_is_zero(dsa->pub_key), iVar1 == 0)) &&
              (iVar1 = BN_cmp((BIGNUM *)dsa->pub_key,(BIGNUM *)dsa->p), iVar1 < 0)))) {
            if (dsa->priv_key == (BIGNUM *)0x0) {
              return 1;
            }
            iVar1 = BN_is_negative(dsa->priv_key);
            if (((iVar1 == 0) && (iVar1 = BN_is_zero(dsa->priv_key), iVar1 == 0)) &&
               (iVar1 = BN_cmp((BIGNUM *)dsa->priv_key,(BIGNUM *)dsa->q), iVar1 < 0)) {
              return 1;
            }
            iVar1 = 0x6b;
            line = 0x53;
          }
          else {
            iVar1 = 0x6b;
            line = 0x48;
          }
        }
        else {
          iVar1 = 0x66;
          line = 0x40;
        }
      }
      else {
        iVar1 = 100;
        line = 0x39;
      }
    }
    else {
      iVar1 = 0x6b;
      line = 0x32;
    }
  }
  ERR_put_error(10,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                ,line);
  return 0;
}

Assistant:

int dsa_check_key(const DSA *dsa) {
  if (!dsa->p || !dsa->q || !dsa->g) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_MISSING_PARAMETERS);
    return 0;
  }

  // Fully checking for invalid DSA groups is expensive, so security and
  // correctness of the signature scheme depend on how |dsa| was computed. I.e.
  // we leave "assurance of domain parameter validity" from FIPS 186-4 to the
  // caller. However, we check bounds on all values to avoid DoS vectors even
  // when domain parameters are invalid. In particular, signing will infinite
  // loop if |g| is zero.
  if (BN_is_negative(dsa->p) || BN_is_negative(dsa->q) || BN_is_zero(dsa->p) ||
      BN_is_zero(dsa->q) || !BN_is_odd(dsa->p) || !BN_is_odd(dsa->q) ||
      // |q| must be a prime divisor of |p - 1|, which implies |q < p|.
      BN_cmp(dsa->q, dsa->p) >= 0 ||
      // |g| is in the multiplicative group of |p|.
      BN_is_negative(dsa->g) || BN_is_zero(dsa->g) ||
      BN_cmp(dsa->g, dsa->p) >= 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_INVALID_PARAMETERS);
    return 0;
  }

  // FIPS 186-4 allows only three different sizes for q.
  unsigned q_bits = BN_num_bits(dsa->q);
  if (q_bits != 160 && q_bits != 224 && q_bits != 256) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_BAD_Q_VALUE);
    return 0;
  }

  // Bound |dsa->p| to avoid a DoS vector. Note this limit is much larger than
  // the one in FIPS 186-4, which only allows L = 1024, 2048, and 3072.
  if (BN_num_bits(dsa->p) > OPENSSL_DSA_MAX_MODULUS_BITS) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_MODULUS_TOO_LARGE);
    return 0;
  }

  if (dsa->pub_key != NULL) {
    // The public key is also in the multiplicative group of |p|.
    if (BN_is_negative(dsa->pub_key) || BN_is_zero(dsa->pub_key) ||
        BN_cmp(dsa->pub_key, dsa->p) >= 0) {
      OPENSSL_PUT_ERROR(DSA, DSA_R_INVALID_PARAMETERS);
      return 0;
    }
  }

  if (dsa->priv_key != NULL) {
    // The private key is a non-zero element of the scalar field, determined by
    // |q|.
    if (BN_is_negative(dsa->priv_key) ||
        constant_time_declassify_int(BN_is_zero(dsa->priv_key)) ||
        constant_time_declassify_int(BN_cmp(dsa->priv_key, dsa->q) >= 0)) {
      OPENSSL_PUT_ERROR(DSA, DSA_R_INVALID_PARAMETERS);
      return 0;
    }
  }

  return 1;
}